

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

BailOutInfo * __thiscall IR::Instr::UnlinkBailOutInfo(Instr *this)

{
  IRKind IVar1;
  BailOutInfo *pBVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lStack_30;
  
  if ((this->field_0x38 & 0x50) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x4cc,"(this->HasBailOutInfo() || this->HasAuxBailOut())",
                       "this->HasBailOutInfo() || this->HasAuxBailOut()");
    if (!bVar4) goto LAB_00481647;
    *puVar5 = 0;
  }
  IVar1 = this->m_kind;
  if (IVar1 == InstrKindInstr) {
    lStack_30 = 0x58;
  }
  else if (IVar1 == InstrKindBranch) {
    lStack_30 = 0x78;
  }
  else {
    if (IVar1 != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x4dd,"(false)","false");
      if (bVar4) {
        *puVar5 = 0;
        return (BailOutInfo *)0x0;
      }
      goto LAB_00481647;
    }
    lStack_30 = 0x60;
  }
  pBVar2 = *(BailOutInfo **)((long)&this->_vptr_Instr + lStack_30);
  *(undefined8 *)((long)&this->_vptr_Instr + lStack_30) = 0;
  if (pBVar2 == (BailOutInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x4e0,"(bailOutInfo)","bailOutInfo");
    if (!bVar4) {
LAB_00481647:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  this->field_0x38 = this->field_0x38 & 0xaf;
  return pBVar2;
}

Assistant:

BailOutInfo *
Instr::UnlinkBailOutInfo()
{
    BailOutInfo *bailOutInfo;
    Assert(this->HasBailOutInfo() || this->HasAuxBailOut());

    switch (this->m_kind)
    {
    case InstrKindInstr:
        bailOutInfo = ((BailOutInstr const *)this)->bailOutInfo;
        ((BailOutInstr *)this)->bailOutInfo = nullptr;
        break;
    case InstrKindProfiled:
        bailOutInfo = ((ProfiledBailOutInstr const *)this)->bailOutInfo;
        ((ProfiledBailOutInstr *)this)->bailOutInfo = nullptr;
        break;
    case InstrKindBranch:
        bailOutInfo = ((BranchBailOutInstr const *)this)->bailOutInfo;
        ((BranchBailOutInstr *)this)->bailOutInfo = nullptr;
        break;
    default:
        Assert(false);
        return nullptr;
    }
    Assert(bailOutInfo);
#if 0
    if (bailOutInfo->bailOutInstr == this)
    {
        bailOutInfo->bailOutInstr = nullptr;
    }
#endif
    this->hasBailOutInfo = false;
    this->hasAuxBailOut = false;

    return bailOutInfo;
}